

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t set)

{
  long lVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t element;
  size_t i_1;
  size_t i;
  sysbvm_array_t *newStorage;
  size_t newCapacity;
  size_t oldCapacity;
  sysbvm_array_t *oldStorage;
  sysbvm_identitySet_t *setObject;
  sysbvm_tuple_t set_local;
  sysbvm_context_t *context_local;
  
  lVar1 = *(long *)(set + 0x18);
  sVar2 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(set + 0x18));
  newStorage = (sysbvm_array_t *)(sVar2 << 1);
  if (newStorage < (sysbvm_array_t *)0x8) {
    newStorage = (sysbvm_array_t *)0x8;
  }
  sVar3 = sysbvm_array_create(context,(sysbvm_tuple_t)newStorage);
  *(sysbvm_tuple_t *)(set + 0x18) = sVar3;
  for (i_1 = 0; i_1 < newStorage; i_1 = i_1 + 1) {
    *(undefined8 *)(sVar3 + 0x10 + i_1 * 8) = 0x3f;
  }
  for (element = 0; element < sVar2; element = element + 1) {
    sVar3 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + element * 8);
    if (sVar3 != 0x3f) {
      sysbvm_identitySet_insertNoCheck(set,sVar3);
    }
  }
  return;
}

Assistant:

static void sysbvm_identitySet_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t set)
{
    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)setObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    setObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t element = oldStorage->elements[i];
        if(element != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_identitySet_insertNoCheck(set, element);
    }
}